

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

Location * __thiscall
c4::yml::Parser::val_location(Location *__return_storage_ptr__,Parser *this,char *val)

{
  ulong *puVar1;
  code *pcVar2;
  size_t sVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  bool bVar15;
  Location *pLVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  ulong *puVar24;
  size_t sVar25;
  byte bVar26;
  char msg [36];
  char local_248 [64];
  undefined4 local_208;
  undefined2 local_204;
  undefined1 local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  char *pcStack_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  char *pcStack_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  char *pcStack_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  char *pcStack_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  char *pcStack_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  char *pcStack_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  char *pcStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  bVar26 = 0;
  if (val == (char *)0x0) {
    pcVar22 = (this->m_file).str;
    sVar25 = (this->m_file).len;
    (__return_storage_ptr__->super_LineCol).offset = 0;
    (__return_storage_ptr__->super_LineCol).line = 0;
    (__return_storage_ptr__->super_LineCol).col = 0;
    (__return_storage_ptr__->name).str = pcVar22;
    lVar18 = 0x20;
  }
  else {
    if (((this->m_options).flags & 1) == 0) {
      builtin_strncpy(local_248,"check failed: m_options.locations()",0x24);
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_48 = 0;
      uStack_40 = 0x8004;
      local_38 = 0;
      pcStack_30 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_28 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x8004) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x8004) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x24,LVar4,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((this->m_buf).str != (this->m_newline_offsets_buf).str) {
      builtin_strncpy(local_248,"check failed: (m_buf.str == m_newline_offsets_buf.str)",0x37);
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_70 = 0;
      uStack_68 = 0x8007;
      local_60 = 0;
      pcStack_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_50 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x8007) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x8007) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x37,LVar5,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((this->m_buf).len != (this->m_newline_offsets_buf).len) {
      builtin_strncpy(local_248,"check failed: (m_buf.len == m_newline_offsets_buf.len)",0x37);
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_98 = 0;
      uStack_90 = 0x8008;
      local_88 = 0;
      pcStack_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_78 = 0x65;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x8008) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x8008) << 0x40,8);
      LVar6.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x37,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    if (((this->m_options).flags & 1) == 0) {
      builtin_strncpy(local_248,"check failed: (m_options.locations())",0x26);
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_c0 = 0;
      uStack_b8 = 0x8009;
      local_b0 = 0;
      pcStack_a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_a0 = 0x65;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x8009) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x8009) << 0x40,8);
      LVar7.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar7.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x26,LVar7,(this->m_stack).m_callbacks.m_user_data);
    }
    if (this->m_newline_offsets_size == 0) {
      builtin_strncpy(local_248,"check failed: (!_locations_dirty())",0x24);
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_e8 = 0;
      uStack_e0 = 0x800a;
      local_d8 = 0;
      pcStack_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8 = 0x65;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x800a) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x800a) << 0x40,8);
      LVar8.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar8.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x24,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
    if (this->m_newline_offsets == (size_t *)0x0) {
      builtin_strncpy(local_248 + 0x20," != nullptr)",0xd);
      builtin_strncpy(local_248 + 0x10,"_newline_offsets",0x10);
      builtin_strncpy(local_248,"check failed: (m",0x10);
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_110 = 0;
      uStack_108 = 0x800b;
      local_100 = 0;
      pcStack_f8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_f0 = 0x65;
      LVar9.super_LineCol.col = 0;
      LVar9.super_LineCol.offset = SUB168(ZEXT816(0x800b) << 0x40,0);
      LVar9.super_LineCol.line = SUB168(ZEXT816(0x800b) << 0x40,8);
      LVar9.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar9.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x2d,LVar9,(this->m_stack).m_callbacks.m_user_data);
    }
    if (this->m_newline_offsets_size == 0) {
      builtin_strncpy(local_248 + 0x20,"_size > 0)",0xb);
      builtin_strncpy(local_248 + 0x10,"_newline_offsets",0x10);
      builtin_strncpy(local_248,"check failed: (m",0x10);
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_138 = 0;
      uStack_130 = 0x800c;
      local_128 = 0;
      pcStack_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_118 = 0x65;
      LVar10.super_LineCol.col = 0;
      LVar10.super_LineCol.offset = SUB168(ZEXT816(0x800c) << 0x40,0);
      LVar10.super_LineCol.line = SUB168(ZEXT816(0x800c) << 0x40,8);
      LVar10.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar10.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x2b,LVar10,(this->m_stack).m_callbacks.m_user_data);
    }
    pcVar22 = (this->m_buf).str;
    if ((val < pcVar22) || (pcVar22 + (this->m_buf).len < val)) {
      pcVar21 = 
      "check failed: (val >= src.begin() && val <= src.end()) || (src.str == nullptr && val == nullptr)"
      ;
      pcVar23 = local_248;
      for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(undefined8 *)pcVar23 = *(undefined8 *)pcVar21;
        pcVar21 = pcVar21 + ((ulong)bVar26 * -2 + 1) * 8;
        pcVar23 = pcVar23 + ((ulong)bVar26 * -2 + 1) * 8;
      }
      local_1e8 = 0;
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_160 = 0;
      uStack_158 = 0x8010;
      local_150 = 0;
      pcStack_148 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_140 = 0x65;
      LVar11.super_LineCol.col = 0;
      LVar11.super_LineCol.offset = SUB168(ZEXT816(0x8010) << 0x40,0);
      LVar11.super_LineCol.line = SUB168(ZEXT816(0x8010) << 0x40,8);
      LVar11.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar11.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x61,LVar11,(this->m_stack).m_callbacks.m_user_data);
    }
    sVar25 = (long)val - (long)pcVar22;
    puVar24 = this->m_newline_offsets;
    uVar17 = this->m_newline_offsets_size;
    if (uVar17 < 0x1e) {
      if (uVar17 != 0) {
        puVar1 = puVar24 + uVar17;
        do {
          if (sVar25 < *puVar24) goto LAB_001e7ff0;
          puVar24 = puVar24 + 1;
        } while (puVar24 < puVar1);
      }
      puVar24 = (ulong *)0x0;
    }
    else {
      do {
        uVar19 = uVar17 >> 1;
        uVar20 = ~uVar19 + uVar17;
        uVar17 = uVar19;
        if (puVar24[uVar19] < sVar25) {
          puVar24 = puVar24 + uVar19 + 1;
          uVar17 = uVar20;
        }
      } while (uVar17 != 0);
    }
LAB_001e7ff0:
    if (puVar24 < this->m_newline_offsets) {
      builtin_strncpy(local_248 + 0x20,"ine_offsets)",0xd);
      builtin_strncpy(local_248 + 0x10,"ineptr >= m_newl",0x10);
      builtin_strncpy(local_248,"check failed: (l",0x10);
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_188 = 0;
      uStack_180 = 0x803a;
      local_178 = 0;
      pcStack_170 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_168 = 0x65;
      LVar12.super_LineCol.col = 0;
      LVar12.super_LineCol.offset = SUB168(ZEXT816(0x803a) << 0x40,0);
      LVar12.super_LineCol.line = SUB168(ZEXT816(0x803a) << 0x40,8);
      LVar12.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar12.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x2d,LVar12,(this->m_stack).m_callbacks.m_user_data);
    }
    if (this->m_newline_offsets + this->m_newline_offsets_size < puVar24) {
      pcVar22 = "check failed: (lineptr <= m_newline_offsets + m_newline_offsets_size)";
      pcVar21 = local_248;
      for (lVar18 = 8; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(undefined8 *)pcVar21 = *(undefined8 *)pcVar22;
        pcVar22 = pcVar22 + ((ulong)bVar26 * -2 + 1) * 8;
        pcVar21 = pcVar21 + ((ulong)bVar26 * -2 + 1) * 8;
      }
      local_204 = 0x29;
      local_208 = 0x657a6973;
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_1b0 = 0;
      uStack_1a8 = 0x803b;
      local_1a0 = 0;
      pcStack_198 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_190 = 0x65;
      LVar13.super_LineCol.col = 0;
      LVar13.super_LineCol.offset = SUB168(ZEXT816(0x803b) << 0x40,0);
      LVar13.super_LineCol.line = SUB168(ZEXT816(0x803b) << 0x40,8);
      LVar13.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar13.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x46,LVar13,(this->m_stack).m_callbacks.m_user_data);
    }
    if (*puVar24 <= sVar25) {
      builtin_strncpy(local_248,"check failed: (*lineptr > offset)",0x22);
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      local_1d8 = 0;
      uStack_1d0 = 0x803c;
      local_1c8 = 0;
      pcStack_1c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_1b8 = 0x65;
      LVar14.super_LineCol.col = 0;
      LVar14.super_LineCol.offset = SUB168(ZEXT816(0x803c) << 0x40,0);
      LVar14.super_LineCol.line = SUB168(ZEXT816(0x803c) << 0x40,8);
      LVar14.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar14.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_248,0x22,LVar14,(this->m_stack).m_callbacks.m_user_data);
    }
    (__return_storage_ptr__->super_LineCol).col = 0;
    (__return_storage_ptr__->name).str = (char *)0x0;
    (__return_storage_ptr__->super_LineCol).offset = 0;
    (__return_storage_ptr__->super_LineCol).line = 0;
    (__return_storage_ptr__->name).len = 0;
    sVar3 = (this->m_file).len;
    (__return_storage_ptr__->name).str = (this->m_file).str;
    (__return_storage_ptr__->name).len = sVar3;
    (__return_storage_ptr__->super_LineCol).offset = sVar25;
    puVar1 = this->m_newline_offsets;
    (__return_storage_ptr__->super_LineCol).line = (long)puVar24 - (long)puVar1 >> 3;
    lVar18 = 0x10;
    if (puVar1 < puVar24) {
      sVar25 = sVar25 + ~puVar24[-1];
    }
  }
  *(size_t *)((long)&(__return_storage_ptr__->super_LineCol).offset + lVar18) = sVar25;
  return __return_storage_ptr__;
}

Assistant:

Location Parser::val_location(const char *val) const
{
    if(C4_UNLIKELY(val == nullptr))
        return {m_file, 0, 0, 0};

    _RYML_CB_CHECK(m_stack.m_callbacks, m_options.locations());
    // NOTE: if any of these checks fails, the parser needs to be
    // instantiated with locations enabled.
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.str == m_newline_offsets_buf.str);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.len == m_newline_offsets_buf.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_options.locations());
    _RYML_CB_ASSERT(m_stack.m_callbacks, !_locations_dirty());
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_newline_offsets != nullptr);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_newline_offsets_size > 0);
    // NOTE: the pointer needs to belong to the buffer that was used to parse.
    csubstr src = m_buf;
    _RYML_CB_CHECK(m_stack.m_callbacks, val != nullptr || src.str == nullptr);
    _RYML_CB_CHECK(m_stack.m_callbacks, (val >= src.begin() && val <= src.end()) || (src.str == nullptr && val == nullptr));
    // ok. search the first stored newline after the given ptr
    using lineptr_type = size_t const* C4_RESTRICT;
    lineptr_type lineptr = nullptr;
    size_t offset = (size_t)(val - src.begin());
    if(m_newline_offsets_size < 30) // TODO magic number
    {
        // just do a linear search if the size is small.
        for(lineptr_type curr = m_newline_offsets, last = m_newline_offsets + m_newline_offsets_size; curr < last; ++curr)
        {
            if(*curr > offset)
            {
                lineptr = curr;
                break;
            }
        }
    }
    else
    {
        // do a bisection search if the size is not small.
        //
        // We could use std::lower_bound but this is simple enough and
        // spares the include of <algorithm>.
        size_t count = m_newline_offsets_size;
        size_t step;
        lineptr_type it;
        lineptr = m_newline_offsets;
        while(count)
        {
            step = count >> 1;
            it = lineptr + step;
            if(*it < offset)
            {
                lineptr = ++it;
                count -= step + 1;
            }
            else
            {
                count = step;
            }
        }
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, lineptr >= m_newline_offsets);
    _RYML_CB_ASSERT(m_stack.m_callbacks, lineptr <= m_newline_offsets + m_newline_offsets_size);
    _RYML_CB_ASSERT(m_stack.m_callbacks, *lineptr > offset);
    Location loc;
    loc.name = m_file;
    loc.offset = offset;
    loc.line = (size_t)(lineptr - m_newline_offsets);
    if(lineptr > m_newline_offsets)
        loc.col = (offset - *(lineptr-1) - 1u);
    else
        loc.col = offset;
    return loc;
}